

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_configmanager.cpp
# Opt level: O1

void cali::internal::init_builtin_configmanager(Caliper *c)

{
  bool bVar1;
  bool allow;
  int iVar2;
  char *config_str;
  ostream *poVar3;
  undefined4 extraout_var;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  mapped_type *pmVar5;
  Events *pEVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  ConfigManager mgr;
  size_type __dnew;
  Channel channel;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cfgmap;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  services;
  allocator_type local_2c9;
  ConfigManager local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  undefined1 local_230 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [12];
  ios_base local_138 [264];
  int local_30;
  
  config_str = getenv("CALI_CONFIG");
  if (config_str != (char *)0x0) {
    ConfigManager::ConfigManager(&local_2c8);
    ConfigManager::add(&local_2c8,config_str);
    bVar1 = ConfigManager::error(&local_2c8);
    if (bVar1) {
      poVar3 = (ostream *)local_230;
      std::ofstream::ofstream(poVar3);
      local_30 = 0;
      iVar2 = Log::verbosity();
      if (local_30 <= iVar2) {
        poVar3 = Log::get_stream((Log *)local_230);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CALI_CONFIG: error: ",0x14);
      ConfigManager::error_msg_abi_cxx11_((string *)local_2a0,&local_2c8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_2a0._0_8_,local_2a0._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
    }
    else {
      local_230 = (undefined1  [8])&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"cali.configmgr.flushed","");
      iVar2 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                        (c,local_230,7,0xc1,0,0,0);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,(ulong)(local_220._M_allocated_capacity + 1));
      }
      cali::services::get_available_services_abi_cxx11_();
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[9]>>
                        (local_270.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_270.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,"mpiflush");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[26],_const_char_(&)[6],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_230,(char (*) [26])"CALI_CHANNEL_CONFIG_CHECK",(char (*) [6])"false");
      __l._M_len = 1;
      __l._M_array = (iterator)local_230;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_2a0,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_2b8,&local_2c9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != local_200) {
        operator_delete(local_210._M_p,local_200[0]._M_allocated_capacity + 1);
      }
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,(ulong)(local_220._M_allocated_capacity + 1));
      }
      if (_Var4._M_current !=
          local_270.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_2b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x14;
        local_230 = (undefined1  [8])&local_220;
        local_230 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_230,(ulong)&local_2b8);
        local_220._M_allocated_capacity = (size_type)local_2b8;
        *(undefined8 *)local_230 = 0x5245535f494c4143;
        *(char *)((long)local_230 + 8) = 'V';
        *(char *)((long)local_230 + 9) = 'I';
        *(char *)((long)local_230 + 10) = 'C';
        *(char *)((long)local_230 + 0xb) = 'E';
        *(char *)((long)local_230 + 0xc) = 'S';
        *(char *)((long)local_230 + 0xd) = '_';
        *(char *)((long)local_230 + 0xe) = 'E';
        *(char *)((long)local_230 + 0xf) = 'N';
        *(char *)((long)local_230 + 0x10) = 'A';
        *(char *)((long)local_230 + 0x11) = 'B';
        *(char *)((long)local_230 + 0x12) = 'L';
        *(char *)((long)local_230 + 0x13) = 'E';
        local_228._M_pi = local_2b8;
        *(char *)((long)local_230 + (long)local_2b8) = '\0';
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_2a0,(key_type *)local_230);
        std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x22f6e5);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,(ulong)(local_220._M_allocated_capacity + 1));
        }
      }
      RuntimeConfig::RuntimeConfig((RuntimeConfig *)local_230);
      RuntimeConfig::allow_read_env((RuntimeConfig *)local_230,allow);
      RuntimeConfig::import
                ((RuntimeConfig *)local_230,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_2a0);
      Caliper::create_channel((Caliper *)local_2b0,(char *)c,(RuntimeConfig *)"builtin.configmgr");
      if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_2a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_270);
      ConfigManager::start(&local_2c8);
      pEVar6 = Channel::events((Channel *)local_2b0);
      local_230 = (undefined1  [8])
                  local_2c8.mP.
                  super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      local_228._M_pi =
           local_2c8.mP.
           super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_2c8.mP.
          super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2c8.mP.
           super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_2c8.mP.
                super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2c8.mP.
           super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_2c8.mP.
                super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      local_248 = (code *)0x0;
      pcStack_240 = (code *)0x0;
      local_220._M_allocated_capacity =
           (size_type)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar2);
      local_258._M_unused._M_object = operator_new(0x18);
      *(undefined1 (*) [8])local_258._M_unused._0_8_ = local_230;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_258._M_unused._0_8_ + 8) =
           local_228._M_pi;
      if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_228._M_pi)->_M_use_count = (local_228._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_228._M_pi)->_M_use_count = (local_228._M_pi)->_M_use_count + 1;
        }
      }
      *(size_type *)((long)local_258._M_unused._0_8_ + 0x10) = local_220._M_allocated_capacity;
      pcStack_240 = std::
                    _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/builtin_configmanager.cpp:81:47)>
                    ::_M_invoke;
      local_248 = std::
                  _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/builtin_configmanager.cpp:81:47)>
                  ::_M_manager;
      std::
      vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>_>_>
      ::push_back(&(pEVar6->write_output_evt).mCb,(value_type *)&local_258);
      if (local_248 != (code *)0x0) {
        (*local_248)(&local_258,&local_258,__destroy_functor);
      }
      ConfigManager::~ConfigManager((ConfigManager *)local_230);
      poVar3 = (ostream *)local_230;
      std::ofstream::ofstream(poVar3);
      local_30 = 1;
      iVar2 = Log::verbosity();
      if (local_30 <= iVar2) {
        poVar3 = Log::get_stream((Log *)local_230);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Registered builtin ConfigManager",0x20);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      Channel::~Channel((Channel *)local_2b0);
    }
    ConfigManager::~ConfigManager(&local_2c8);
  }
  return;
}

Assistant:

void init_builtin_configmanager(Caliper* c)
{
    const char* configstr = std::getenv("CALI_CONFIG");

    if (!configstr)
        return;

    ConfigManager mgr;
    mgr.add(configstr);

    if (mgr.error()) {
        Log(0).stream() << "CALI_CONFIG: error: " << mgr.error_msg() << std::endl;
        return;
    }

    //   Make a channel to trigger the ConfigManager flush. Use the mpiflush
    // service if it is available to trigger flushes at MPI_Finalize(). In
    // that case, set the configmgr.flushed attribute to skip flushing at the
    // end of the program.

    Attribute flag_attr = c->create_attribute(
        "cali.configmgr.flushed",
        CALI_TYPE_BOOL,
        CALI_ATTR_SKIP_EVENTS | CALI_ATTR_HIDDEN | CALI_ATTR_ASVALUE
    );

    Channel channel = ::make_flush_trigger_channel(c);

    mgr.start();

    channel.events().write_output_evt.connect([mgr, flag_attr](Caliper* c, ChannelBody* chB, SnapshotView) mutable {
        if (c->get(chB, flag_attr).value().to_bool() == true)
            return;

        mgr.flush();

        c->set(chB, flag_attr, Variant(true));
    });

    Log(1).stream() << "Registered builtin ConfigManager" << std::endl;
}